

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O2

void __thiscall
OpenMD::BondOrderParameter::BondOrderParameter
          (BondOrderParameter *this,SimInfo *info,string *filename,string *sele,double rCut,
          uint nbins)

{
  SelectionEvaluator *this_00;
  _Rb_tree_header *p_Var1;
  double l1;
  double dVar2;
  RealType RVar3;
  int ii;
  uint uVar4;
  ostream *poVar5;
  RealType *thrcof;
  long lVar6;
  mapped_type *pmVar7;
  mapped_type *this_01;
  ulong uVar8;
  long lVar9;
  int mmm;
  RealType *__x;
  uint local_254;
  RealType m2M;
  RealType m2m;
  string paramString;
  pair<int,_int> lm;
  int error;
  stringstream params;
  ostream local_1a8 [376];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__BondOrderParameter_002ecd28;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  SelectionManager::SelectionManager(&this->seleMan_,info);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m2Min)._M_t._M_impl.super__Rb_tree_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m2Max)._M_t._M_impl.super__Rb_tree_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->w3j)._M_t._M_impl.super__Rb_tree_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Qcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Qcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Qcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Wcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Wcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Wcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->W_histogram_)._M_t._M_impl.super__Rb_tree_header;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&params,"Bond Order Parameters",(allocator<char> *)&paramString);
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  std::__cxx11::string::~string((string *)&params);
  getPrefix(&paramString,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                 &paramString,".bo");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&params);
  std::__cxx11::string::~string((string *)&paramString);
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&params,this_00);
    SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)&params);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&params);
  }
  this->rCut_ = rCut;
  this->nBins_ = nbins;
  std::__cxx11::stringstream::stringstream((stringstream *)&params);
  std::operator<<(local_1a8," rcut = ");
  poVar5 = std::ostream::_M_insert<double>(this->rCut_);
  poVar5 = std::operator<<(poVar5,", nbins = ");
  std::ostream::operator<<((ostream *)poVar5,this->nBins_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  std::vector<int,_std::allocator<int>_>::resize(&this->Qcount_,0xd);
  std::vector<int,_std::allocator<int>_>::resize(&this->Wcount_,0xd);
  this->MinQ_ = 0.0;
  this->MaxQ_ = 1.1;
  this->deltaQ_ = 1.1 / (double)this->nBins_;
  this->MinW_ = -1.1;
  this->MaxW_ = 1.1;
  this->deltaW_ = 2.2 / (double)this->nBins_;
  thrcof = (RealType *)operator_new__(200);
  local_254 = 1;
  lVar9 = 1;
  for (uVar8 = 0; uVar8 != 0xd; uVar8 = uVar8 + 1) {
    l1 = (double)(int)uVar8;
    for (uVar4 = -(int)uVar8; uVar4 != local_254; uVar4 = uVar4 + 1) {
      lm = (pair<int,_int>)((ulong)uVar4 << 0x20 | uVar8);
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
        thrcof[lVar6] = 0.0;
      }
      MATPACK::Wigner3jm(l1,l1,l1,(double)(int)uVar4,&m2m,&m2M,thrcof,0x19,&error);
      RVar3 = m2m;
      pmVar7 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->m2Min,&lm);
      dVar2 = floor(RVar3);
      RVar3 = m2M;
      *pmVar7 = (int)dVar2;
      pmVar7 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->m2Max,&lm);
      dVar2 = floor(RVar3);
      *pmVar7 = (int)dVar2;
      __x = thrcof;
      for (lVar6 = 0; lVar6 <= (int)(m2M - m2m); lVar6 = lVar6 + 1) {
        this_01 = std::
                  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->w3j,&lm);
        std::vector<double,_std::allocator<double>_>::push_back(this_01,__x);
        __x = __x + 1;
      }
    }
    lVar9 = lVar9 + 2;
    local_254 = local_254 + 1;
  }
  operator_delete__(thrcof);
  std::__cxx11::string::~string((string *)&paramString);
  std::__cxx11::stringstream::~stringstream((stringstream *)&params);
  return;
}

Assistant:

BondOrderParameter::BondOrderParameter(SimInfo* info,
                                         const std::string& filename,
                                         const std::string& sele, double rCut,
                                         unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setAnalysisType("Bond Order Parameters");
    setOutputName(getPrefix(filename) + ".bo");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius and order of the Legendre Polynomial:

    rCut_  = rCut;
    nBins_ = nbins;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    Qcount_.resize(lMax_ + 1);
    Wcount_.resize(lMax_ + 1);

    // Q can take values from 0 to 1

    MinQ_   = 0.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / (nBins_);

    // W_6 for icosahedral clusters is 11 / sqrt(4199) = 0.169754, so we'll
    // use values for MinW_ and MaxW_ that are slightly larger than this:

    MinW_   = -1.1;
    MaxW_   = 1.1;
    deltaW_ = (MaxW_ - MinW_) / (nBins_);

    // Make arrays for Wigner3jm
    RealType* THRCOF = new RealType[2 * lMax_ + 1];
    // Variables for Wigner routine
    RealType lPass, m1Pass, m2m, m2M;
    int error, mSize;
    mSize = 2 * lMax_ + 1;

    for (int l = 0; l <= lMax_; l++) {
      lPass = (RealType)l;
      for (int m1 = -l; m1 <= l; m1++) {
        m1Pass = (RealType)m1;

        std::pair<int, int> lm = std::make_pair(l, m1);

        // Zero work array
        for (int ii = 0; ii < 2 * l + 1; ii++) {
          THRCOF[ii] = 0.0;
        }

        // Get Wigner coefficients
        Wigner3jm(lPass, lPass, lPass, m1Pass, m2m, m2M, THRCOF, mSize, error);

        m2Min[lm] = (int)floor(m2m);
        m2Max[lm] = (int)floor(m2M);

        for (int mmm = 0; mmm <= (int)(m2M - m2m); mmm++) {
          w3j[lm].push_back(THRCOF[mmm]);
        }
      }
    }
    delete[] THRCOF;
    THRCOF = NULL;
  }